

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O3

void __thiscall OpenMD::RigidBody::updateAtoms(RigidBody *this,int frame)

{
  double dVar1;
  Atom *pAVar2;
  bool bVar3;
  uint i;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  undefined4 extraout_var_00;
  long *plVar6;
  double *pdVar7;
  undefined8 *puVar8;
  uint i_1;
  long lVar9;
  double *pdVar10;
  double (*padVar11) [3];
  ulong uVar12;
  double (*padVar13) [3];
  uint k;
  long lVar14;
  SquareMatrix3<double> result_1;
  Vector3d ref;
  SquareMatrix3<double> result;
  RotMat3x3d a;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined8 local_118;
  Vector3d local_108;
  double local_e8 [4];
  double local_c8 [10];
  double local_78 [9];
  
  local_108.super_Vector<double,_3U>.data_[0] = 0.0;
  local_108.super_Vector<double,_3U>.data_[1] = 0.0;
  local_108.super_Vector<double,_3U>.data_[2] = 0.0;
  iVar4 = (*((this->super_StuntDouble).snapshotMan_)->_vptr_SnapshotManager[4])();
  lVar9 = (long)(this->super_StuntDouble).localIndex_;
  lVar5 = *(long *)(CONCAT44(extraout_var,iVar4) + (this->super_StuntDouble).storage_);
  pdVar7 = (double *)(lVar5 + lVar9 * 0x18);
  local_e8[0] = *pdVar7;
  local_e8[1] = pdVar7[1];
  local_e8[2] = *(double *)(lVar5 + 0x10 + lVar9 * 0x18);
  StuntDouble::getA((RotMat3x3d *)local_78,&this->super_StuntDouble,frame);
  if ((this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar12 = 0;
    do {
      StuntDouble::body2Lab
                (&local_108,&this->super_StuntDouble,
                 (this->refCoords_).
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar12,frame);
      local_178 = 0;
      uStack_170 = 0;
      local_168 = 0;
      lVar5 = 0;
      do {
        (&local_178)[lVar5] = local_e8[lVar5] + local_108.super_Vector<double,_3U>.data_[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      local_118 = local_168;
      local_128 = (undefined4)local_178;
      uStack_124 = local_178._4_4_;
      uStack_120 = (undefined4)uStack_170;
      uStack_11c = uStack_170._4_4_;
      pAVar2 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar12];
      iVar4 = (*((pAVar2->super_StuntDouble).snapshotMan_)->_vptr_SnapshotManager[4])();
      lVar9 = (long)(pAVar2->super_StuntDouble).localIndex_;
      lVar5 = *(long *)(CONCAT44(extraout_var_00,iVar4) + (pAVar2->super_StuntDouble).storage_);
      puVar8 = (undefined8 *)(lVar5 + lVar9 * 0x18);
      *puVar8 = CONCAT44(uStack_124,local_128);
      puVar8[1] = CONCAT44(uStack_11c,uStack_120);
      *(undefined8 *)(lVar5 + 0x10 + lVar9 * 0x18) = local_118;
      bVar3 = AtomType::isDirectional
                        ((this->atoms_).
                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                         .super__Vector_impl_data._M_start[uVar12]->atomType_);
      if (bVar3) {
        pAVar2 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar12];
        if (pAVar2 == (Atom *)0x0) {
          plVar6 = (long *)0x0;
        }
        else {
          plVar6 = (long *)__dynamic_cast(pAVar2,&Atom::typeinfo,&DirectionalAtom::typeinfo);
        }
        padVar11 = (double (*) [3])
                   ((this->refOrients_).
                    super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar12);
        local_c8[6] = 0.0;
        local_c8[7] = 0.0;
        local_c8[4] = 0.0;
        local_c8[5] = 0.0;
        local_c8[2] = 0.0;
        local_c8[3] = 0.0;
        local_c8[0] = 0.0;
        local_c8[1] = 0.0;
        local_c8[8] = 0.0;
        pdVar7 = local_c8;
        lVar5 = 0;
        do {
          lVar9 = 0;
          pdVar10 = pdVar7;
          do {
            *pdVar10 = (((SquareMatrix<double,_3> *)*padVar11)->super_RectMatrix<double,_3U,_3U>).
                       data_[0][lVar9];
            lVar9 = lVar9 + 1;
            pdVar10 = pdVar10 + 3;
          } while (lVar9 != 3);
          lVar5 = lVar5 + 1;
          pdVar7 = pdVar7 + 1;
          padVar11 = padVar11 + 1;
        } while (lVar5 != 3);
        local_148 = 0;
        uStack_140 = 0;
        local_158 = 0;
        uStack_150 = 0;
        local_168 = 0;
        uStack_160 = 0;
        local_178 = 0;
        uStack_170 = 0;
        local_138 = 0;
        puVar8 = local_c8;
        lVar5 = 0;
        do {
          lVar9 = 0;
          padVar11 = (double (*) [3])local_78;
          do {
            dVar1 = (double)(&local_178)[lVar5 * 3 + lVar9];
            lVar14 = 0;
            padVar13 = padVar11;
            do {
              dVar1 = dVar1 + (double)puVar8[lVar14] *
                              (((SquareMatrix<double,_3> *)*padVar13)->
                              super_RectMatrix<double,_3U,_3U>).data_[0][0];
              lVar14 = lVar14 + 1;
              padVar13 = padVar13 + 1;
            } while (lVar14 != 3);
            (&local_178)[lVar5 * 3 + lVar9] = dVar1;
            lVar9 = lVar9 + 1;
            padVar11 = (double (*) [3])(*padVar11 + 1);
          } while (lVar9 != 3);
          lVar5 = lVar5 + 1;
          puVar8 = puVar8 + 3;
        } while (lVar5 != 3);
        (**(code **)(*plVar6 + 0x20))(plVar6,&local_178,frame);
      }
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (uVar12 < (ulong)((long)(this->atoms_).
                                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->atoms_).
                                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void RigidBody::updateAtoms(int frame) {
    unsigned int i;
    Vector3d ref;
    Vector3d apos;
    DirectionalAtom* dAtom;
    Vector3d pos = getPos(frame);
    RotMat3x3d a = getA(frame);

    for (i = 0; i < atoms_.size(); i++) {
      ref = body2Lab(refCoords_[i], frame);

      apos = pos + ref;

      atoms_[i]->setPos(apos, frame);

      if (atoms_[i]->isDirectional()) {
        dAtom = dynamic_cast<DirectionalAtom*>(atoms_[i]);
        dAtom->setA(refOrients_[i].transpose() * a, frame);
      }
    }
  }